

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase3::Run(BasicAtomicCase3 *this)

{
  CallLogWrapper *this_00;
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  GLuint GVar4;
  void *pvVar5;
  long lVar6;
  allocator<char> local_cd;
  allocator<char> local_cc;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  GLuint u;
  size_type sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  GLint i;
  string local_80;
  string local_60;
  string local_40;
  
  bVar3 = ShaderStorageBufferObjectBase::SupportedInVS((ShaderStorageBufferObjectBase *)this,1);
  lVar6 = 0x10;
  if ((bVar3) &&
     (bVar3 = ShaderStorageBufferObjectBase::SupportedInGS((ShaderStorageBufferObjectBase *)this,1),
     bVar3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&u,
               "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_vs_buffer;\nvoid main() {\n  gl_Position = g_in_position;\n  atomicAdd(g_vs_buffer.u[0].x, g_vs_buffer.u[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.u[0][0], g_vs_buffer.u[gl_VertexID].z);\n  atomicAdd(g_vs_buffer.i[0].x, g_vs_buffer.i[gl_VertexID][1]);\n  atomicAdd(g_vs_buffer.i[0][0], g_vs_buffer.i[gl_VertexID].z);\n}"
               ,&local_c9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,glcts::fixed_sample_locations_values + 1,&local_ca);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,glcts::fixed_sample_locations_values + 1,&local_cb);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_gs_buffer;\nvoid main() {\n  gl_Position = gl_in[0].gl_Position;\n  gl_PrimitiveID = gl_PrimitiveIDIn;\n  EmitVertex();\n  atomicAdd(g_gs_buffer.u[0].x, g_gs_buffer.u[gl_PrimitiveIDIn][1]);\n  atomicAdd(g_gs_buffer.i[0].x, g_gs_buffer.i[gl_PrimitiveIDIn][1]);\n}"
               ,&local_cc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 0) buffer Buffer {\n  uvec4 u[4];\n  ivec3 i[4];\n} g_fs_buffer;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n  atomicAdd(g_fs_buffer.u[0].x, g_fs_buffer.u[gl_PrimitiveID][1]);\n  atomicAdd(g_fs_buffer.i[0].x, g_fs_buffer.i[gl_PrimitiveID][1]);\n}"
               ,&local_cd);
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      ((ShaderStorageBufferObjectBase *)this,(string *)&u,(string *)&i,&local_40,
                       &local_60,&local_80);
    *(GLuint *)&(this->super_ComputeShaderBase).renderTarget = GVar4;
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)&u);
    this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram
              (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      ((ShaderStorageBufferObjectBase *)this,
                       *(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
    lVar6 = -1;
    if (bVar3) {
      glu::CallLogWrapper::glGenBuffers
                (this_00,1,(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
      glu::CallLogWrapper::glBindBufferBase
                (this_00,0x90d2,0,
                 *(GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x80,(void *)0x0,0x88e8);
      pvVar5 = glu::CallLogWrapper::glMapBuffer(this_00,0x90d2,0x88b9);
      if (pvVar5 != (void *)0x0) {
        for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 0x20) {
          *(undefined8 *)((long)pvVar5 + lVar6) = 0x100000000;
          ((undefined8 *)((long)pvVar5 + lVar6))[1] = 2;
          puVar1 = (undefined8 *)((long)pvVar5 + lVar6 + 0x10);
          *puVar1 = 0x100000000;
          puVar1[1] = 2;
        }
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        local_b8._M_allocated_capacity = 0x3f4ccccdbf4ccccd;
        local_b8._8_8_ = 0x3f4ccccd3f4ccccd;
        _u = (pointer)0xbf4ccccdbf4ccccd;
        sStack_c0 = 0xbf4ccccd3f4ccccd;
        glu::CallLogWrapper::glGenBuffers
                  (this_00,1,(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
        glu::CallLogWrapper::glBindBuffer
                  (this_00,0x8892,
                   *(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
        glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,&u,0x88e4);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glGenVertexArrays
                  (this_00,1,(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
        glu::CallLogWrapper::glBindVertexArray
                  (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
        glu::CallLogWrapper::glBindBuffer
                  (this_00,0x8892,
                   *(GLuint *)((long)&(this->super_ComputeShaderBase).pixelFormat + 4));
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram
                  (this_00,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
        glu::CallLogWrapper::glBindVertexArray
                  (this_00,*(GLuint *)&(this->super_ComputeShaderBase).pixelFormat);
        glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&u);
        uVar2 = u;
        if ((u == 0x14) &&
           (glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0x40,4,&i), uVar2 = i, i == 0x14)
           ) {
          return 0;
        }
        anon_unknown_0::Output("Data at offset 0 is %d should be %d.\n",(ulong)uVar2,0x14);
        lVar6 = -1;
      }
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(64, 1, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 64), true))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 4), false))
			return ERROR;
		if (!RunIteration(uvec3(3, 2, 1), true))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 2), false))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 7), true))
			return ERROR;
		return NO_ERROR;
	}